

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void __thiscall FWeaponSlots::PrintSettings(FWeaponSlots *this)

{
  long lVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  FWeaponSlot *pFVar4;
  long lVar5;
  
  uVar2 = 1;
  do {
    uVar3 = (ulong)uVar2;
    if (uVar2 == 10) {
      uVar3 = 0;
    }
    if (0 < (int)this->Slots[uVar3].Weapons.Count) {
      pFVar4 = this->Slots + uVar3;
      Printf("Slot[%d]=");
      if (0 < (int)(pFVar4->Weapons).Count) {
        lVar5 = 0;
        lVar1 = 0;
        do {
          Printf("%s ",FName::NameData.NameArray
                       [*(int *)(*(long *)((long)&((pFVar4->Weapons).Array)->Type + lVar5) + 0x88)].
                       Text);
          lVar1 = lVar1 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar1 < (int)(pFVar4->Weapons).Count);
      }
      Printf("\n");
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xb);
  return;
}

Assistant:

void FWeaponSlots::PrintSettings()
{
	for (int i = 1; i <= NUM_WEAPON_SLOTS; ++i)
	{
		int slot = i % NUM_WEAPON_SLOTS;
		if (Slots[slot].Size() > 0)
		{
			Printf("Slot[%d]=", slot);
			for (int j = 0; j < Slots[slot].Size(); ++j)
			{
				Printf("%s ", Slots[slot].GetWeapon(j)->TypeName.GetChars());
			}
			Printf("\n");
		}
	}
}